

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_convert_tile_tushort
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,int *intlength,int *status)

{
  short sVar1;
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  short *in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  long ii;
  int *idata;
  int *in_stack_00000018;
  int flagval;
  short *sbuff;
  unsigned_short *usbuff;
  long local_70;
  int shift;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  if (((((int)ii != 0x10) || (in_XMM0_Qa != 1.0)) || (NAN(in_XMM0_Qa))) ||
     ((in_XMM1_Qa != 32768.0 || (NAN(in_XMM1_Qa))))) {
    ffpmsg((char *)0x204b98);
    *in_stack_00000018 = 0x19d;
    local_4 = 0x19d;
  }
  else {
    if (((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0xb) ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x15)) ||
       ((*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x16 ||
        (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x33)))) {
      *idata = 2;
      if (in_ECX == 1) {
        sVar1 = *in_R8;
        for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
          if (*(short *)((long)in_RSI + local_70 * 2) == sVar1) {
            *(short *)((long)in_RSI + local_70 * 2) = (short)in_R9D;
          }
          else {
            *(ushort *)((long)in_RSI + local_70 * 2) =
                 *(ushort *)((long)in_RSI + local_70 * 2) ^ 0x8000;
          }
        }
      }
      else {
        for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
          *(ushort *)((long)in_RSI + local_70 * 2) =
               *(ushort *)((long)in_RSI + local_70 * 2) ^ 0x8000;
        }
      }
    }
    else {
      *idata = 4;
      if (in_ECX == 1) {
        sVar1 = *in_R8;
        for (local_70 = in_RDX + -1; -1 < local_70; local_70 = local_70 + -1) {
          if (*(short *)((long)in_RSI + local_70 * 2) == sVar1) {
            in_RSI[local_70] = in_R9D;
          }
          else {
            in_RSI[local_70] = *(ushort *)((long)in_RSI + local_70 * 2) - 0x8000;
          }
        }
      }
      else {
        shift = (int)((ulong)in_XMM1_Qa >> 0x20);
        if (*(int *)(*(long *)(in_RDI + 8) + 0x43c) == 0x29) {
          fits_ushort_to_int_inplace
                    ((unsigned_short *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),(long)in_XMM0_Qa,
                     shift,in_RSI);
        }
        else {
          fits_ushort_to_int_inplace
                    ((unsigned_short *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),(long)in_XMM0_Qa,
                     shift,in_RSI);
        }
      }
    }
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int imcomp_convert_tile_tushort(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *status)
{
    /*  Prepare the input  tile array of pixels for compression. */
    /*  Convert input unsigned integer*2 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    unsigned short *usbuff;
    short *sbuff;
    int flagval, *idata;
    long ii;
    
       /* datatype of input array is unsigned short.  We only support writing this datatype
          to a FITS image with BITPIX = 16 and with BZERO = 0 and BSCALE = 32768.  */

       if (zbitpix != SHORT_IMG || scale != 1.0 || zero != 32768.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       usbuff = (unsigned short *) tiledata;
       sbuff = (short *) tiledata;
       idata = (int *) tiledata;

       if ((outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
        || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1) 
       {
           /* don't have to convert to int if using gzip, bzip2, or Rice compression */
           *intlength = 2;

          /* offset the unsigned value by -32768 to a signed short value. */
	  /* It is more efficient to do this by just flipping the most significant of the 16 bits */

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression  */
               flagval = *(unsigned short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbuff[ii] == (unsigned short) flagval)
		       sbuff[ii] = (short) nullval;
                    else
		       usbuff[ii] =  (usbuff[ii]) ^ 0x8000;
               }
           } else {
               /* just offset the pixel values by 32768 (by flipping the MSB */
               for (ii = tilelen - 1; ii >= 0; ii--)
		       usbuff[ii] =  (usbuff[ii]) ^ 0x8000;
           }
       } else {
           /* have to convert to int if using HCOMPRESS or PLIO */
           *intlength = 4;

           if (nullcheck == 1) {
               /* offset the pixel values by 32768, and */
               /* reset pixels equal to flagval to nullval */
               flagval = *(unsigned short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (usbuff[ii] == (unsigned short) flagval)
		       idata[ii] = nullval;
                    else
		       idata[ii] = ((int) usbuff[ii]) - 32768;
               }
           } else {  /* just do the data type conversion to int */
               /* for HCOMPRESS we need to simply subtract 32768 */
               /* for PLIO, have to convert usbuff to an I*4 array, in place */
               /* usbuff must have been allocated large enough to do this */

               if ((outfptr->Fptr)->compress_type == HCOMPRESS_1) {
                    fits_ushort_to_int_inplace(usbuff, tilelen, -32768, status);
               } else {
                    fits_ushort_to_int_inplace(usbuff, tilelen, 0, status);
               }
           }
        }

        return(*status);
}